

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

size_t lj_gc_separateudata(global_State *g,int all)

{
  GCobj *root;
  cTValue *pcVar1;
  uint *puVar2;
  byte bVar3;
  uint uVar4;
  GCtab *mt;
  uint *puVar5;
  uint *puVar6;
  size_t sVar7;
  
  puVar5 = (uint *)(ulong)(g->mainthref).gcptr32;
  uVar4 = *puVar5;
  if (uVar4 == 0) {
    sVar7 = 0;
  }
  else {
    sVar7 = 0;
    do {
      puVar6 = (uint *)(ulong)uVar4;
      bVar3 = (byte)puVar6[1];
      if (((bVar3 & 8) == 0) && ((bVar3 & 3) != 0 || all != 0)) {
        mt = (GCtab *)(ulong)puVar6[4];
        if ((mt != (GCtab *)0x0) && ((mt->nomm & 4) == 0)) {
          pcVar1 = lj_meta_cache(mt,MM_gc,(GCstr *)(ulong)g->gcroot[2].gcptr32);
          bVar3 = (byte)puVar6[1];
          if (pcVar1 != (cTValue *)0x0) {
            sVar7 = sVar7 + puVar6[3] + 0x18;
            *(byte *)(puVar6 + 1) = bVar3 | 8;
            *puVar5 = *puVar6;
            puVar2 = (uint *)(ulong)(g->gc).mmudata.gcptr32;
            if (puVar2 == (uint *)0x0) {
              *puVar6 = uVar4;
            }
            else {
              *puVar6 = *puVar2;
              *puVar2 = uVar4;
            }
            (g->gc).mmudata.gcptr32 = uVar4;
            puVar6 = puVar5;
            goto LAB_0010fd58;
          }
        }
        *(byte *)(puVar6 + 1) = bVar3 | 8;
      }
LAB_0010fd58:
      uVar4 = *puVar6;
      puVar5 = puVar6;
    } while (uVar4 != 0);
  }
  return sVar7;
}

Assistant:

size_t lj_gc_separateudata(global_State *g, int all)
{
  size_t m = 0;
  GCRef *p = &mainthread(g)->nextgc;
  GCobj *o;
  while ((o = gcref(*p)) != NULL) {
    if (!(iswhite(o) || all) || isfinalized(gco2ud(o))) {
      p = &o->gch.nextgc;  /* Nothing to do. */
    } else if (!lj_meta_fastg(g, tabref(gco2ud(o)->metatable), MM_gc)) {
      markfinalized(o);  /* Done, as there's no __gc metamethod. */
      p = &o->gch.nextgc;
    } else {  /* Otherwise move userdata to be finalized to mmudata list. */
      m += sizeudata(gco2ud(o));
      markfinalized(o);
      *p = o->gch.nextgc;
      if (gcref(g->gc.mmudata)) {  /* Link to end of mmudata list. */
	GCobj *root = gcref(g->gc.mmudata);
	setgcrefr(o->gch.nextgc, root->gch.nextgc);
	setgcref(root->gch.nextgc, o);
	setgcref(g->gc.mmudata, o);
      } else {  /* Create circular list. */
	setgcref(o->gch.nextgc, o);
	setgcref(g->gc.mmudata, o);
      }
    }
  }
  return m;
}